

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

ProcessorAndChannel * __thiscall
soul::heart::Parser::readProcessorAndChannel
          (ProcessorAndChannel *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int32_t local_8c;
  char *local_88;
  string local_80;
  undefined1 local_60 [32];
  undefined1 local_40 [8];
  string name;
  Parser *this_local;
  ProcessorAndChannel *processorAndChannel;
  
  name.field_2._M_local_buf[0xf] = '\0';
  ProcessorAndChannel::ProcessorAndChannel(__return_storage_ptr__);
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)local_40,this);
  local_60._8_8_ = ".";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x548358);
  if (bVar1) {
    findProcessorInstance((Parser *)local_60,(string *)this);
    (__return_storage_ptr__->processor).object = (ProcessorInstance *)local_60._0_8_;
    pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
              ((pool_ptr<soul::heart::ProcessorInstance> *)local_60);
    readGeneralIdentifier_abi_cxx11_(&local_80,this);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->endpoint,(string *)&local_80)
    ;
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->endpoint,(string *)local_40);
  }
  local_88 = "[";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x575e01);
  if (bVar1) {
    local_8c = parseInt32(this);
    std::optional<unsigned_long>::operator=(&__return_storage_ptr__->endpointIndex,&local_8c);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x54ace4);
  }
  name.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    ProcessorAndChannel::~ProcessorAndChannel(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ProcessorAndChannel readProcessorAndChannel()
    {
        ProcessorAndChannel processorAndChannel;

        auto name = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::dot))
        {
            processorAndChannel.processor = findProcessorInstance (name);
            processorAndChannel.endpoint   = readGeneralIdentifier();
        }
        else
        {
            processorAndChannel.endpoint = name;
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            processorAndChannel.endpointIndex = parseInt32();

            expect (HEARTOperator::closeBracket);
        }

        return processorAndChannel;
    }